

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

char * Curl_ssl_snihost(Curl_easy *data,char *host,size_t *olen)

{
  size_t sVar1;
  char *pcVar2;
  ulong n;
  
  sVar1 = strlen(host);
  if (sVar1 == 0) {
    n = 0;
  }
  else {
    n = sVar1 - (host[sVar1 - 1] == '.');
  }
  if (n < (data->set).buffer_size) {
    Curl_strntolower((data->state).buffer,host,n);
    (data->state).buffer[n] = '\0';
    if (olen != (size_t *)0x0) {
      *olen = n;
    }
    pcVar2 = (data->state).buffer;
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

char *Curl_ssl_snihost(struct Curl_easy *data, const char *host, size_t *olen)
{
  size_t len = strlen(host);
  if(len && (host[len-1] == '.'))
    len--;
  if(len >= data->set.buffer_size)
    return NULL;

  Curl_strntolower(data->state.buffer, host, len);
  data->state.buffer[len] = 0;
  if(olen)
    *olen = len;
  return data->state.buffer;
}